

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertToSignExtendedInteger
          (IEEEFloat *this,MutableArrayRef<unsigned_long> parts,uint width,bool isSigned,
          roundingMode rounding_mode,bool *isExact)

{
  uint srcBits;
  byte bVar1;
  bool bVar2;
  lostFraction lost_fraction;
  uint uVar3;
  WordType WVar4;
  Significand *src;
  opStatus oVar5;
  uint unaff_EBP;
  WordType *dst;
  uint uVar6;
  uint parts_00;
  bool bVar7;
  
  dst = parts.super_ArrayRef<unsigned_long>.Data;
  *isExact = false;
  bVar1 = this->field_0x12 & 7;
  if (bVar1 < 2) {
    return opInvalidOp;
  }
  parts_00 = width + 0x3f >> 6;
  if (parts.super_ArrayRef<unsigned_long>.Length < (ulong)parts_00) {
    __assert_fail("dstPartsCount <= parts.size() && \"Integer too big\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x802,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertToSignExtendedInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                 );
  }
  if (bVar1 == 3) {
    APInt::tcSet(dst,0,parts_00);
    bVar7 = (this->field_0x12 & 8) == 0;
    goto LAB_001674d6;
  }
  uVar3 = this->semantics->precision;
  if (uVar3 - 0x40 < 0xffffff80) {
    src = (Significand *)(this->significand).parts;
  }
  else {
    src = &this->significand;
  }
  uVar6 = (uint)this->exponent;
  if (this->exponent < 0) {
    APInt::tcSet(dst,0,parts_00);
    unaff_EBP = ~(int)this->exponent + this->semantics->precision;
  }
  else {
    if (uVar6 < width) {
      srcBits = uVar6 + 1;
      unaff_EBP = uVar3 - srcBits;
      if (uVar3 < srcBits || unaff_EBP == 0) {
        unaff_EBP = 0;
        APInt::tcExtract(dst,parts_00,&src->part,uVar3,0);
        APInt::tcShiftLeft(dst,parts_00,srcBits - this->semantics->precision);
      }
      else {
        APInt::tcExtract(dst,parts_00,&src->part,srcBits,unaff_EBP);
      }
    }
    if (width <= uVar6) {
      return opInvalidOp;
    }
  }
  bVar2 = true;
  if ((unaff_EBP != 0) &&
     (lost_fraction =
           lostFractionThroughTruncation
                     (&src->part,this->semantics->precision + 0x40 >> 6,unaff_EBP),
     lost_fraction != lfExactlyZero)) {
    bVar2 = roundAwayFromZero(this,rounding_mode,lost_fraction,unaff_EBP);
    if ((bVar2) && (WVar4 = APInt::tcAddPart(dst,1,parts_00), WVar4 != 0)) {
      return opInvalidOp;
    }
    bVar2 = false;
  }
  uVar6 = APInt::tcMSB(dst,parts_00);
  uVar3 = uVar6 + 1;
  if ((this->field_0x12 & 8) == 0) {
    bVar7 = uVar3 < !isSigned + width;
    oVar5 = opInvalidOp;
    if (bVar7) {
      oVar5 = opInexact;
    }
    bVar2 = (bool)(bVar7 & bVar2);
  }
  else {
    if (isSigned) {
      if (uVar3 == width) {
        uVar3 = APInt::tcLSB(dst,parts_00);
        bVar7 = uVar3 == uVar6;
        goto LAB_0016766d;
      }
      if (width < uVar3) {
        return opInvalidOp;
      }
    }
    else {
      bVar7 = uVar6 == 0xffffffff;
LAB_0016766d:
      if (!bVar7) {
        return opInvalidOp;
      }
    }
    APInt::tcNegate(dst,parts_00);
    oVar5 = opInexact;
  }
  bVar7 = true;
  if (!bVar2) {
    return oVar5;
  }
LAB_001674d6:
  *isExact = bVar7;
  return opOK;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertToSignExtendedInteger(
    MutableArrayRef<integerPart> parts, unsigned int width, bool isSigned,
    roundingMode rounding_mode, bool *isExact) const {
  lostFraction lost_fraction;
  const integerPart *src;
  unsigned int dstPartsCount, truncatedBits;

  *isExact = false;

  /* Handle the three special cases first.  */
  if (category == fcInfinity || category == fcNaN)
    return opInvalidOp;

  dstPartsCount = partCountForBits(width);
  assert(dstPartsCount <= parts.size() && "Integer too big");

  if (category == fcZero) {
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    // Negative zero can't be represented as an int.
    *isExact = !sign;
    return opOK;
  }

  src = significandParts();

  /* Step 1: place our absolute value, with any fraction truncated, in
     the destination.  */
  if (exponent < 0) {
    /* Our absolute value is less than one; truncate everything.  */
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    /* For exponent -1 the integer bit represents .5, look at that.
       For smaller exponents leftmost truncated bit is 0. */
    truncatedBits = semantics->precision -1U - exponent;
  } else {
    /* We want the most significant (exponent + 1) bits; the rest are
       truncated.  */
    unsigned int bits = exponent + 1U;

    /* Hopelessly large in magnitude?  */
    if (bits > width)
      return opInvalidOp;

    if (bits < semantics->precision) {
      /* We truncate (semantics->precision - bits) bits.  */
      truncatedBits = semantics->precision - bits;
      APInt::tcExtract(parts.data(), dstPartsCount, src, bits, truncatedBits);
    } else {
      /* We want at least as many bits as are available.  */
      APInt::tcExtract(parts.data(), dstPartsCount, src, semantics->precision,
                       0);
      APInt::tcShiftLeft(parts.data(), dstPartsCount,
                         bits - semantics->precision);
      truncatedBits = 0;
    }
  }

  /* Step 2: work out any lost fraction, and increment the absolute
     value if we would round away from zero.  */
  if (truncatedBits) {
    lost_fraction = lostFractionThroughTruncation(src, partCount(),
                                                  truncatedBits);
    if (lost_fraction != lfExactlyZero &&
        roundAwayFromZero(rounding_mode, lost_fraction, truncatedBits)) {
      if (APInt::tcIncrement(parts.data(), dstPartsCount))
        return opInvalidOp;     /* Overflow.  */
    }
  } else {
    lost_fraction = lfExactlyZero;
  }

  /* Step 3: check if we fit in the destination.  */
  unsigned int omsb = APInt::tcMSB(parts.data(), dstPartsCount) + 1;

  if (sign) {
    if (!isSigned) {
      /* Negative numbers cannot be represented as unsigned.  */
      if (omsb != 0)
        return opInvalidOp;
    } else {
      /* It takes omsb bits to represent the unsigned integer value.
         We lose a bit for the sign, but care is needed as the
         maximally negative integer is a special case.  */
      if (omsb == width &&
          APInt::tcLSB(parts.data(), dstPartsCount) + 1 != omsb)
        return opInvalidOp;

      /* This case can happen because of rounding.  */
      if (omsb > width)
        return opInvalidOp;
    }

    APInt::tcNegate (parts.data(), dstPartsCount);
  } else {
    if (omsb >= width + !isSigned)
      return opInvalidOp;
  }

  if (lost_fraction == lfExactlyZero) {
    *isExact = true;
    return opOK;
  } else
    return opInexact;
}